

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_setopt(Curl_multi *multi,CURLMoption option,...)

{
  CURLMcode CVar1;
  va_list param;
  char **local_a8;
  
  CVar1 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (multi->type == 0xbab1e)) {
    CVar1 = CURLM_UNKNOWN_OPTION;
    switch(option) {
    case CURLMOPT_PIPELINING:
      multi->pipelining = (long)local_a8;
      break;
    case 4:
    case 5:
    case 9:
    case 10:
    case CURLMOPT_MAX_PIPELINE_LENGTH|CURLMOPT_PIPELINING:
    case 0xc:
      goto switchD_004bbfce_caseD_4;
    case CURLMOPT_MAXCONNECTS:
      multi->maxconnects = (long)local_a8;
      break;
    case CURLMOPT_MAX_HOST_CONNECTIONS:
      multi->max_host_connections = (long)local_a8;
      break;
    case CURLMOPT_MAX_PIPELINE_LENGTH:
      multi->max_pipeline_length = (long)local_a8;
      break;
    case CURLMOPT_MAX_TOTAL_CONNECTIONS:
      multi->max_total_connections = (long)local_a8;
      break;
    default:
      if (option == CURLMOPT_SOCKETDATA) {
        multi->socket_userp = local_a8;
      }
      else if (option == CURLMOPT_TIMERDATA) {
        multi->timer_userp = local_a8;
      }
      else {
        if (option == CURLMOPT_PIPELINING_SITE_BL) {
          CVar1 = Curl_pipeline_set_site_blacklist(local_a8,&multi->pipelining_site_bl);
          return CVar1;
        }
        if (option == CURLMOPT_PIPELINING_SERVER_BL) {
          CVar1 = Curl_pipeline_set_server_blacklist(local_a8,&multi->pipelining_server_bl);
          return CVar1;
        }
        if (option == CURLMOPT_PUSHDATA) {
          multi->push_userp = local_a8;
        }
        else if (option == CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE) {
          multi->chunk_length_penalty_size = (long)local_a8;
        }
        else if (option == CURLMOPT_TIMERFUNCTION) {
          multi->timer_cb = (curl_multi_timer_callback)local_a8;
        }
        else if (option == CURLMOPT_PUSHFUNCTION) {
          multi->push_cb = (curl_push_callback)local_a8;
        }
        else if (option == CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE) {
          multi->content_length_penalty_size = (long)local_a8;
        }
        else {
          if (option != CURLMOPT_SOCKETFUNCTION) {
            return CURLM_UNKNOWN_OPTION;
          }
          multi->socket_cb = (curl_socket_callback)local_a8;
        }
      }
    }
    CVar1 = CURLM_OK;
  }
switchD_004bbfce_caseD_4:
  return CVar1;
}

Assistant:

CURLMcode curl_multi_setopt(struct Curl_multi *multi,
                            CURLMoption option, ...)
{
  CURLMcode res = CURLM_OK;
  va_list param;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  va_start(param, option);

  switch(option) {
  case CURLMOPT_SOCKETFUNCTION:
    multi->socket_cb = va_arg(param, curl_socket_callback);
    break;
  case CURLMOPT_SOCKETDATA:
    multi->socket_userp = va_arg(param, void *);
    break;
  case CURLMOPT_PUSHFUNCTION:
    multi->push_cb = va_arg(param, curl_push_callback);
    break;
  case CURLMOPT_PUSHDATA:
    multi->push_userp = va_arg(param, void *);
    break;
  case CURLMOPT_PIPELINING:
    multi->pipelining = va_arg(param, long);
    break;
  case CURLMOPT_TIMERFUNCTION:
    multi->timer_cb = va_arg(param, curl_multi_timer_callback);
    break;
  case CURLMOPT_TIMERDATA:
    multi->timer_userp = va_arg(param, void *);
    break;
  case CURLMOPT_MAXCONNECTS:
    multi->maxconnects = va_arg(param, long);
    break;
  case CURLMOPT_MAX_HOST_CONNECTIONS:
    multi->max_host_connections = va_arg(param, long);
    break;
  case CURLMOPT_MAX_PIPELINE_LENGTH:
    multi->max_pipeline_length = va_arg(param, long);
    break;
  case CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE:
    multi->content_length_penalty_size = va_arg(param, long);
    break;
  case CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE:
    multi->chunk_length_penalty_size = va_arg(param, long);
    break;
  case CURLMOPT_PIPELINING_SITE_BL:
    res = Curl_pipeline_set_site_blacklist(va_arg(param, char **),
                                           &multi->pipelining_site_bl);
    break;
  case CURLMOPT_PIPELINING_SERVER_BL:
    res = Curl_pipeline_set_server_blacklist(va_arg(param, char **),
                                             &multi->pipelining_server_bl);
    break;
  case CURLMOPT_MAX_TOTAL_CONNECTIONS:
    multi->max_total_connections = va_arg(param, long);
    break;
  default:
    res = CURLM_UNKNOWN_OPTION;
    break;
  }
  va_end(param);
  return res;
}